

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_5::SetMessageVariables
               (FieldDescriptor *descriptor,int messageBitIndex,int builderBitIndex,
               FieldGeneratorInfo *info,Context *context,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  ClassNameResolver *pCVar1;
  bool bVar2;
  FieldDescriptor *pFVar3;
  Descriptor *pDVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  FileDescriptor *pFVar7;
  FieldOptions *this;
  mapped_type *this_00;
  int bitIndex;
  int bitIndex_00;
  FieldDescriptor *field;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  Descriptor *descriptor_00;
  undefined1 boxed;
  undefined7 uVar8;
  allocator local_8e1;
  key_type local_8e0;
  string local_8c0 [39];
  allocator local_899;
  key_type local_898;
  string local_878;
  string local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  allocator local_7d1;
  key_type local_7d0;
  allocator local_7a9;
  key_type local_7a8;
  allocator local_781;
  key_type local_780;
  allocator local_759;
  key_type local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  allocator local_711;
  key_type local_710;
  string local_6f0;
  allocator local_6c9;
  key_type local_6c8;
  string local_6a8;
  allocator local_681;
  key_type local_680;
  allocator local_659;
  key_type local_658;
  allocator local_631;
  key_type local_630;
  allocator local_609;
  key_type local_608;
  allocator local_5e1;
  key_type local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  allocator local_579;
  key_type local_578;
  string local_558;
  allocator local_531;
  key_type local_530;
  string local_510;
  allocator local_4e9;
  key_type local_4e8;
  string local_4c8;
  allocator local_4a1;
  key_type local_4a0;
  string local_480;
  allocator local_459;
  key_type local_458;
  string local_438;
  allocator local_411;
  key_type local_410;
  allocator local_3e9;
  key_type local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  allocator local_3a1;
  key_type local_3a0;
  string local_380;
  allocator local_359;
  key_type local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  allocator local_2f1;
  key_type local_2f0;
  string local_2d0;
  allocator local_2a9;
  key_type local_2a8;
  allocator local_281;
  key_type local_280;
  allocator local_259;
  key_type local_258;
  allocator local_231;
  key_type local_230;
  allocator local_209;
  key_type local_208;
  string local_1e8;
  allocator local_1c1;
  key_type local_1c0;
  string local_1a0;
  allocator local_179;
  key_type local_178;
  string local_158 [39];
  allocator local_131;
  key_type local_130;
  undefined1 local_110 [8];
  string boxed_key_type;
  key_type local_e8;
  string local_c8;
  JavaType local_a8;
  JavaType local_a4;
  JavaType valueJavaType;
  JavaType keyJavaType;
  FieldDescriptor *value;
  FieldDescriptor *key;
  allocator local_79;
  key_type local_78;
  string local_58;
  FieldDescriptor *local_38;
  ClassNameResolver *name_resolver;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables_local;
  Context *context_local;
  FieldGeneratorInfo *info_local;
  int builderBitIndex_local;
  int messageBitIndex_local;
  FieldDescriptor *descriptor_local;
  
  boxed = SUB81(context,0);
  uVar8 = (undefined7)((ulong)context >> 8);
  name_resolver = (ClassNameResolver *)variables;
  variables_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *)context;
  context_local = (Context *)info;
  info_local._0_4_ = builderBitIndex;
  info_local._4_4_ = messageBitIndex;
  _builderBitIndex_local = descriptor;
  SetCommonFieldVariables(descriptor,info,variables);
  pFVar3 = (FieldDescriptor *)Context::GetNameResolver((Context *)variables_local);
  local_38 = pFVar3;
  pDVar4 = FieldDescriptor::message_type(_builderBitIndex_local);
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_58,(ClassNameResolver *)pFVar3,pDVar4);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"type",&local_79);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_78);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_58);
  value = KeyField(_builderBitIndex_local);
  _valueJavaType = ValueField(_builderBitIndex_local);
  local_a4 = GetJavaType(value);
  local_a8 = GetJavaType(_valueJavaType);
  (anonymous_namespace)::TypeName_abi_cxx11_
            (&local_c8,(_anonymous_namespace_ *)value,local_38,(ClassNameResolver *)0x0,(bool)boxed)
  ;
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,"key_type",(allocator *)(boxed_key_type.field_2._M_local_buf + 0xf)
            );
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_e8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)(boxed_key_type.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_c8);
  (anonymous_namespace)::TypeName_abi_cxx11_
            ((string *)local_110,(_anonymous_namespace_ *)value,local_38,(ClassNameResolver *)0x1,
             (bool)boxed);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"boxed_key_type",&local_131);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_130);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::rfind((char)local_110,0x2e);
  std::__cxx11::string::substr((ulong)local_158,(ulong)local_110);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"short_key_type",&local_179);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_178);
  std::__cxx11::string::operator=((string *)pmVar5,local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string(local_158);
  (anonymous_namespace)::WireType_abi_cxx11_(&local_1a0,(_anonymous_namespace_ *)value,field);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"key_wire_type",&local_1c1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_1c0);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string((string *)&local_1a0);
  DefaultValue_abi_cxx11_
            (&local_1e8,(java *)value,(FieldDescriptor *)0x1,SUB81(local_38,0),
             (ClassNameResolver *)CONCAT71(uVar8,boxed));
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"key_default_value",&local_209);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_208);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string((string *)&local_1e8);
  bVar2 = IsReferenceType(local_a4);
  pCVar1 = name_resolver;
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "if (key == null) { throw new java.lang.NullPointerException(); }";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"key_null_check",&local_231);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_230);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  bVar2 = IsReferenceType(local_a8);
  pCVar1 = name_resolver;
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "if (value == null) { throw new java.lang.NullPointerException(); }";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"value_null_check",&local_259);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_258);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  pCVar1 = name_resolver;
  if (local_a8 == JAVATYPE_ENUM) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,"value_type",&local_281);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_280);
    std::__cxx11::string::operator=((string *)pmVar5,"int");
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2a8,"boxed_value_type",&local_2a9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_2a8);
    std::__cxx11::string::operator=((string *)pmVar5,"java.lang.Integer");
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
    (anonymous_namespace)::WireType_abi_cxx11_
              (&local_2d0,(_anonymous_namespace_ *)_valueJavaType,field_00);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"value_wire_type",&local_2f1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_2f0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    std::__cxx11::string::~string((string *)&local_2d0);
    DefaultValue_abi_cxx11_
              (&local_338,(java *)_valueJavaType,(FieldDescriptor *)0x1,SUB81(local_38,0),
               (ClassNameResolver *)CONCAT71(uVar8,boxed));
    std::operator+(&local_318,&local_338,".getNumber()");
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_358,"value_default_value",&local_359);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_358);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator((allocator<char> *)&local_359);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_380,(_anonymous_namespace_ *)_valueJavaType,local_38,(ClassNameResolver *)0x0,
               (bool)boxed);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"value_enum_type",&local_3a1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_3a0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    std::__cxx11::string::~string((string *)&local_380);
    pFVar7 = FieldDescriptor::file(_builderBitIndex_local);
    bVar2 = SupportUnknownEnumValue(pFVar7);
    pCVar1 = name_resolver;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3e8,"value_enum_type",&local_3e9);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)pCVar1,&local_3e8);
      std::operator+(&local_3c8,pmVar5,".UNRECOGNIZED");
      pCVar1 = name_resolver;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_410,"unrecognized_value",&local_411);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)pCVar1,&local_410);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_410);
      std::allocator<char>::~allocator((allocator<char> *)&local_411);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    }
    else {
      DefaultValue_abi_cxx11_
                (&local_438,(java *)_valueJavaType,(FieldDescriptor *)0x1,SUB81(local_38,0),
                 (ClassNameResolver *)CONCAT71(uVar8,boxed));
      pCVar1 = name_resolver;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_458,"unrecognized_value",&local_459);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)pCVar1,&local_458);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_438);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator((allocator<char> *)&local_459);
      std::__cxx11::string::~string((string *)&local_438);
    }
  }
  else {
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_480,(_anonymous_namespace_ *)_valueJavaType,local_38,(ClassNameResolver *)0x0,
               (bool)boxed);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a0,"value_type",&local_4a1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_4a0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    std::__cxx11::string::~string((string *)&local_480);
    (anonymous_namespace)::TypeName_abi_cxx11_
              (&local_4c8,(_anonymous_namespace_ *)_valueJavaType,local_38,(ClassNameResolver *)0x1,
               (bool)boxed);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4e8,"boxed_value_type",&local_4e9);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_4e8);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
    std::__cxx11::string::~string((string *)&local_4c8);
    (anonymous_namespace)::WireType_abi_cxx11_
              (&local_510,(_anonymous_namespace_ *)_valueJavaType,field_01);
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_530,"value_wire_type",&local_531);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_530);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    std::__cxx11::string::~string((string *)&local_510);
    DefaultValue_abi_cxx11_
              (&local_558,(java *)_valueJavaType,(FieldDescriptor *)0x1,SUB81(local_38,0),
               (ClassNameResolver *)CONCAT71(uVar8,boxed));
    pCVar1 = name_resolver;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_578,"value_default_value",&local_579);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)pCVar1,&local_578);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    std::__cxx11::string::~string((string *)&local_558);
  }
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e0,"boxed_key_type",&local_5e1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_5e0);
  std::operator+(&local_5c0,pmVar5,", ");
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_608,"boxed_value_type",&local_609);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_608);
  std::operator+(&local_5a0,&local_5c0,pmVar5);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_630,"type_parameters",&local_631);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_630);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  this = FieldDescriptor::options(_builderBitIndex_local);
  bVar2 = FieldOptions::deprecated(this);
  pCVar1 = name_resolver;
  pcVar6 = "";
  if (bVar2) {
    pcVar6 = "@java.lang.Deprecated ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_658,"deprecation",&local_659);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_658);
  std::__cxx11::string::operator=((string *)pmVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_680,"on_changed",&local_681);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_680);
  std::__cxx11::string::operator=((string *)pmVar5,"onChanged();");
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator((allocator<char> *)&local_681);
  GenerateGetBitMutableLocal_abi_cxx11_(&local_6a8,(java *)(ulong)(uint)info_local,bitIndex);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c8,"get_mutable_bit_parser",&local_6c9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_6c8);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::__cxx11::string::~string((string *)&local_6a8);
  GenerateSetBitMutableLocal_abi_cxx11_(&local_6f0,(java *)(ulong)(uint)info_local,bitIndex_00);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_710,"set_mutable_bit_parser",&local_711);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_710);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator((allocator<char> *)&local_711);
  std::__cxx11::string::~string((string *)&local_6f0);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_758,"capitalized_name",&local_759);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_758);
  std::operator+(&local_738,pmVar5,"DefaultEntryHolder.defaultEntry");
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_780,"default_entry",&local_781);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_780);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_738);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  std::__cxx11::string::~string((string *)&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7a8,"default_entry",&local_7a9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_7a8);
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7d0,"map_field_parameter",&local_7d1);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)pCVar1,&local_7d0);
  std::__cxx11::string::operator=((string *)this_00,(string *)pmVar5);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
  pFVar3 = local_38;
  pFVar7 = FieldDescriptor::file(_builderBitIndex_local);
  ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
            (&local_858,(ClassNameResolver *)pFVar3,pFVar7);
  std::operator+(&local_838,&local_858,".internal_");
  pDVar4 = FieldDescriptor::message_type(_builderBitIndex_local);
  UniqueFileScopeIdentifier_abi_cxx11_(&local_878,(java *)pDVar4,descriptor_00);
  std::operator+(&local_818,&local_838,&local_878);
  std::operator+(&local_7f8,&local_818,"_descriptor, ");
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_898,"descriptor",&local_899);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_898);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_898);
  std::allocator<char>::~allocator((allocator<char> *)&local_899);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_818);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_838);
  std::__cxx11::string::~string((string *)&local_858);
  GeneratedCodeVersionSuffix_abi_cxx11_();
  pCVar1 = name_resolver;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8e0,"ver",&local_8e1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)pCVar1,&local_8e0);
  std::__cxx11::string::operator=((string *)pmVar5,local_8c0);
  std::__cxx11::string::~string((string *)&local_8e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e1);
  std::__cxx11::string::~string(local_8c0);
  std::__cxx11::string::~string((string *)local_110);
  return;
}

Assistant:

void SetMessageVariables(const FieldDescriptor* descriptor,
                         int messageBitIndex,
                         int builderBitIndex,
                         const FieldGeneratorInfo* info,
                         Context* context,
                         std::map<string, string>* variables) {
  SetCommonFieldVariables(descriptor, info, variables);
  ClassNameResolver* name_resolver = context->GetNameResolver();

  (*variables)["type"] =
      name_resolver->GetImmutableClassName(descriptor->message_type());
  const FieldDescriptor* key = KeyField(descriptor);
  const FieldDescriptor* value = ValueField(descriptor);
  const JavaType keyJavaType = GetJavaType(key);
  const JavaType valueJavaType = GetJavaType(value);

  (*variables)["key_type"] = TypeName(key, name_resolver, false);
  string boxed_key_type = TypeName(key, name_resolver, true);
  (*variables)["boxed_key_type"] = boxed_key_type;
  // Used for calling the serialization function.
  (*variables)["short_key_type"] =
      boxed_key_type.substr(boxed_key_type.rfind('.') + 1);
  (*variables)["key_wire_type"] = WireType(key);
  (*variables)["key_default_value"] = DefaultValue(key, true, name_resolver);
  (*variables)["key_null_check"] = IsReferenceType(keyJavaType) ?
      "if (key == null) { throw new java.lang.NullPointerException(); }" : "";
  (*variables)["value_null_check"] = IsReferenceType(valueJavaType) ?
      "if (value == null) { throw new java.lang.NullPointerException(); }" : "";
  if (valueJavaType == JAVATYPE_ENUM) {
    // We store enums as Integers internally.
    (*variables)["value_type"] = "int";
    (*variables)["boxed_value_type"] = "java.lang.Integer";
    (*variables)["value_wire_type"] = WireType(value);
    (*variables)["value_default_value"] =
        DefaultValue(value, true, name_resolver) + ".getNumber()";

    (*variables)["value_enum_type"] = TypeName(value, name_resolver, false);

    if (SupportUnknownEnumValue(descriptor->file())) {
      // Map unknown values to a special UNRECOGNIZED value if supported.
      (*variables)["unrecognized_value"] =
          (*variables)["value_enum_type"] + ".UNRECOGNIZED";
    } else {
      // Map unknown values to the default value if we don't have UNRECOGNIZED.
      (*variables)["unrecognized_value"] =
          DefaultValue(value, true, name_resolver);
    }
  } else {
    (*variables)["value_type"] = TypeName(value, name_resolver, false);
    (*variables)["boxed_value_type"] = TypeName(value, name_resolver, true);
    (*variables)["value_wire_type"] = WireType(value);
    (*variables)["value_default_value"] =
        DefaultValue(value, true, name_resolver);
  }
  (*variables)["type_parameters"] =
      (*variables)["boxed_key_type"] + ", " + (*variables)["boxed_value_type"];
  // TODO(birdo): Add @deprecated javadoc when generating javadoc is supported
  // by the proto compiler
  (*variables)["deprecation"] = descriptor->options().deprecated()
      ? "@java.lang.Deprecated " : "";
  (*variables)["on_changed"] = "onChanged();";

  // For repeated fields, one bit is used for whether the array is immutable
  // in the parsing constructor.
  (*variables)["get_mutable_bit_parser"] =
      GenerateGetBitMutableLocal(builderBitIndex);
  (*variables)["set_mutable_bit_parser"] =
      GenerateSetBitMutableLocal(builderBitIndex);

  (*variables)["default_entry"] = (*variables)["capitalized_name"] +
      "DefaultEntryHolder.defaultEntry";
  (*variables)["map_field_parameter"] = (*variables)["default_entry"];
  (*variables)["descriptor"] =
      name_resolver->GetImmutableClassName(descriptor->file()) +
      ".internal_" + UniqueFileScopeIdentifier(descriptor->message_type()) +
      "_descriptor, ";
  (*variables)["ver"] = GeneratedCodeVersionSuffix();
}